

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFPageObjectHelper::forEachFormXObject
          (QPDFPageObjectHelper *this,bool recursive,
          function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *action)

{
  _Any_data local_58;
  code *local_48;
  code *local_40;
  function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_38;
  
  std::
  function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_38,action);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<bool_(QPDFObjectHandle),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFPageObjectHelper.cc:371:39)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(QPDFObjectHandle),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFPageObjectHelper.cc:371:39)>
             ::_M_manager;
  forEachXObject(this,recursive,&local_38,(function<bool_(QPDFObjectHandle)> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::_Function_base::~_Function_base(&local_38.super__Function_base);
  return;
}

Assistant:

void
QPDFPageObjectHelper::forEachFormXObject(
    bool recursive,
    std::function<void(QPDFObjectHandle& obj, QPDFObjectHandle& xobj_dict, std::string const& key)>
        action)
{
    forEachXObject(recursive, action, [](QPDFObjectHandle obj) { return obj.isFormXObject(); });
}